

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  ImGuiID *pIVar1;
  ImGuiTabItem *pIVar2;
  undefined8 *puVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ImGuiWindow *pIVar7;
  ImVec2 IVar8;
  ImGuiShrinkWidthItem *pIVar9;
  ImGuiTabItem *pIVar10;
  ImVec2 size;
  ImGuiID IVar11;
  ImGuiID IVar12;
  ImGuiID IVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  ImGuiID IVar20;
  ImGuiID IVar21;
  ImGuiContext *pIVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  int section_n;
  long lVar26;
  ImGuiTabItem *pIVar27;
  int iVar28;
  int iVar29;
  byte bVar30;
  ImGuiID *pIVar31;
  uint uVar32;
  ulong uVar33;
  ImGuiID IVar34;
  long lVar35;
  int iVar36;
  int tab_n;
  long lVar37;
  ImGuiContext *pIVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined8 uStack_110;
  ImGuiTabBarSection sections [3];
  ImGuiID local_d8;
  int shrink_buffer_indexes [3];
  ImVec2 local_88;
  ImVec4 local_78;
  undefined8 local_68;
  ImGuiContext *local_60;
  ImVec4 arrow_col;
  
  pIVar38 = GImGui;
  tab_bar->WantLayout = false;
  sections[0].Spacing = 0.0;
  sections[0].TabCount = 0;
  sections[0].Width = 0.0;
  sections[1].TabCount = 0;
  sections[1].Width = 0.0;
  sections[1].Spacing = 0.0;
  sections[2].TabCount = 0;
  sections[2].Width = 0.0;
  sections[2].Spacing = 0.0;
  lVar26 = 0;
  bVar30 = 0;
  uVar32 = 0;
  for (uVar33 = 0; uVar4 = (tab_bar->Tabs).Size, (long)uVar33 < (long)(int)uVar4;
      uVar33 = uVar33 + 1) {
    pIVar27 = (tab_bar->Tabs).Data;
    pIVar31 = (ImGuiID *)((long)&pIVar27->ID + lVar26);
    if ((*(int *)((long)&pIVar27->LastFrameVisible + lVar26) < tab_bar->PrevFrameVisible) ||
       ((&pIVar27->WantClose)[lVar26] == true)) {
      IVar34 = *pIVar31;
      if (tab_bar->VisibleTabId == IVar34) {
        tab_bar->VisibleTabId = 0;
        IVar34 = *pIVar31;
      }
      if (tab_bar->SelectedTabId == IVar34) {
        tab_bar->SelectedTabId = 0;
        IVar34 = *pIVar31;
      }
      if (tab_bar->NextSelectedTabId == IVar34) {
        tab_bar->NextSelectedTabId = 0;
      }
    }
    else {
      if (uVar33 != uVar32) {
        IVar34 = *pIVar31;
        IVar11 = pIVar31[1];
        IVar12 = pIVar31[2];
        IVar13 = pIVar31[3];
        IVar20 = pIVar31[4];
        IVar21 = pIVar31[5];
        uVar14 = *(undefined8 *)(pIVar31 + 6);
        uVar15 = *(undefined8 *)((long)pIVar31 + 0x21);
        puVar3 = (undefined8 *)((long)&pIVar27[(int)uVar32].ContentWidth + 1);
        *puVar3 = *(undefined8 *)((long)pIVar31 + 0x19);
        puVar3[1] = uVar15;
        pIVar10 = pIVar27 + (int)uVar32;
        pIVar10->Offset = (float)IVar20;
        pIVar10->Width = (float)IVar21;
        *(undefined8 *)(&pIVar10->Offset + 2) = uVar14;
        pIVar27 = pIVar27 + (int)uVar32;
        pIVar27->ID = IVar34;
        pIVar27->Flags = IVar11;
        pIVar27->LastFrameVisible = IVar12;
        pIVar27->LastFrameSelected = IVar13;
        pIVar27 = (tab_bar->Tabs).Data;
      }
      pIVar27[(int)uVar32].IndexDuringLayout = (ImS16)uVar32;
      uVar4 = pIVar27[(int)uVar32].Flags;
      lVar37 = 0;
      if ((uVar4 & 0x40) == 0) {
        lVar37 = (ulong)((char)(byte)uVar4 < '\0') + 1;
      }
      if (0 < (int)uVar32) {
        uVar5 = (tab_bar->Tabs).Data[(ulong)uVar32 - 1].Flags;
        bVar30 = (uVar5 & 0x40) == 0 & (byte)uVar4 >> 6 | bVar30 |
                 ((uVar4 & 0xc0) != 0x80 && (uVar5 & 0xc0) == 0x80);
      }
      sections[lVar37].TabCount = sections[lVar37].TabCount + 1;
      uVar32 = uVar32 + 1;
    }
    lVar26 = lVar26 + 0x2c;
  }
  if (uVar4 != uVar32) {
    uStack_110 = 0x1fa45d;
    ImVector<ImGuiTabItem>::resize(&tab_bar->Tabs,uVar32);
  }
  if (bVar30 != 0) {
    uStack_110 = 0x1fa479;
    ImQsort((tab_bar->Tabs).Data,(long)(tab_bar->Tabs).Size,0x2c,TabItemComparerBySection);
  }
  sections[1].Spacing = 0.0;
  sections[0].Spacing = 0.0;
  if (0 < sections[2].TabCount + sections[1].TabCount && 0 < sections[0].TabCount) {
    sections[0].Spacing = (pIVar38->Style).ItemInnerSpacing.x;
  }
  if (0 < sections[2].TabCount && 0 < sections[1].TabCount) {
    sections[1].Spacing = (pIVar38->Style).ItemInnerSpacing.x;
  }
  local_d8 = tab_bar->NextSelectedTabId;
  if (local_d8 != 0) {
    tab_bar->SelectedTabId = local_d8;
    tab_bar->NextSelectedTabId = 0;
  }
  if (tab_bar->ReorderRequestTabId != 0) {
    uStack_110 = 0x1fa4ea;
    bVar23 = TabBarProcessReorder(tab_bar);
    if ((bVar23) && (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)) {
      local_d8 = tab_bar->ReorderRequestTabId;
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  pIVar22 = GImGui;
  if ((tab_bar->Flags & 4) != 0) {
    pIVar7 = GImGui->CurrentWindow;
    fVar39 = (GImGui->Style).FramePadding.y;
    fVar41 = GImGui->FontSize;
    IVar8 = (pIVar7->DC).CursorPos;
    fVar40 = (tab_bar->BarRect).Min.y;
    (pIVar7->DC).CursorPos.x = (tab_bar->BarRect).Min.x - fVar39;
    (pIVar7->DC).CursorPos.y = fVar40;
    (tab_bar->BarRect).Min.x = fVar41 + fVar39 + (tab_bar->BarRect).Min.x;
    arrow_col.x = (pIVar22->Style).Colors[0].x;
    arrow_col.y = (pIVar22->Style).Colors[0].y;
    uVar16 = (pIVar22->Style).Colors[0].z;
    uVar17 = (pIVar22->Style).Colors[0].w;
    arrow_col.w = (float)uVar17 * 0.5;
    arrow_col.z = (float)uVar16;
    uStack_110 = 0x1fa58f;
    PushStyleColor(0,&arrow_col);
    local_78.x = 0.0;
    local_78.y = 0.0;
    local_78.z = 0.0;
    local_78.w = 0.0;
    uStack_110 = 0x1fa5a5;
    PushStyleColor(0x15,&local_78);
    uStack_110 = 0x1fa5b6;
    bVar23 = BeginCombo("##v",(char *)0x0,0x50);
    uStack_110 = 0x1fa5c1;
    PopStyleColor(2);
    if (bVar23) {
      lVar37 = 0;
      pIVar31 = (ImGuiID *)0x0;
      for (lVar26 = 0; lVar26 < (tab_bar->Tabs).Size; lVar26 = lVar26 + 1) {
        pIVar27 = (tab_bar->Tabs).Data;
        if ((*(byte *)((long)&pIVar27->Flags + lVar37 + 2) & 0x20) == 0) {
          local_78.x = 0.0;
          local_78.y = 0.0;
          uStack_110 = 0x1fa621;
          bVar23 = Selectable((tab_bar->TabsNames).Buf.Data +
                              *(int *)((long)&pIVar27->NameOffset + lVar37),
                              tab_bar->SelectedTabId == *(ImGuiID *)((long)&pIVar27->ID + lVar37),0,
                              (ImVec2 *)&local_78);
          if (bVar23) {
            pIVar31 = (ImGuiID *)((long)&pIVar27->ID + lVar37);
          }
        }
        lVar37 = lVar37 + 0x2c;
      }
      uStack_110 = 0x1fa63f;
      EndPopup();
      (pIVar7->DC).CursorPos = IVar8;
      if (pIVar31 != (ImGuiID *)0x0) {
        local_d8 = *pIVar31;
        tab_bar->SelectedTabId = local_d8;
      }
    }
    else {
      (pIVar7->DC).CursorPos = IVar8;
    }
  }
  shrink_buffer_indexes[0] = 0;
  shrink_buffer_indexes[1] = sections[2].TabCount + sections[0].TabCount;
  shrink_buffer_indexes[2] = sections[0].TabCount;
  uStack_110 = 0x1fa683;
  ImVector<ImGuiShrinkWidthItem>::resize(&pIVar38->ShrinkWidthBuffer,(tab_bar->Tabs).Size);
  uVar33 = 0xffffffffffffffff;
  lVar37 = 0;
  lVar26 = 0;
  bVar23 = false;
  pIVar31 = (ImGuiID *)0x0;
  local_60 = pIVar38;
  while( true ) {
    iVar36 = (tab_bar->Tabs).Size;
    if (iVar36 <= lVar26) break;
    pIVar27 = (tab_bar->Tabs).Data;
    pIVar1 = (ImGuiID *)((long)&pIVar27->ID + lVar37);
    if (((pIVar31 == (ImGuiID *)0x0) ||
        ((int)pIVar31[3] < *(int *)((long)&pIVar27->LastFrameSelected + lVar37))) &&
       ((*(byte *)((long)&pIVar27->Flags + lVar37 + 2) & 0x20) == 0)) {
      pIVar31 = pIVar1;
    }
    IVar34 = *pIVar1;
    if (IVar34 == tab_bar->SelectedTabId) {
      bVar23 = true;
    }
    if ((local_d8 == 0) && (local_d8 = IVar34, pIVar38->NavJustMovedToId != IVar34)) {
      local_d8 = 0;
    }
    fVar39 = *(float *)((long)&pIVar27->RequestedWidth + lVar37);
    uVar32 = *(uint *)((long)&pIVar27->Flags + lVar37);
    if (fVar39 < 0.0) {
      uStack_110 = 0x1fa734;
      IVar8 = TabItemCalcSize((tab_bar->TabsNames).Buf.Data +
                              *(int *)((long)&pIVar27->NameOffset + lVar37),
                              (uVar32 & 0x100001) != 0x100000);
      fVar39 = IVar8.x;
      uVar32 = *(uint *)((long)&pIVar27->Flags + lVar37);
      pIVar38 = local_60;
    }
    iVar36 = (int)uVar33;
    *(float *)((long)&pIVar27->ContentWidth + lVar37) = fVar39;
    uVar33 = (ulong)(((char)uVar32 < '\0') + 1);
    if ((uVar32 & 0x40) != 0) {
      uVar33 = 0;
    }
    fVar41 = 0.0;
    if ((int)uVar33 == iVar36) {
      fVar41 = (pIVar38->Style).ItemInnerSpacing.x;
    }
    sections[uVar33].Width = fVar39 + fVar41 + sections[uVar33].Width;
    iVar36 = shrink_buffer_indexes[uVar33];
    shrink_buffer_indexes[uVar33] = iVar36 + 1;
    pIVar9 = (pIVar38->ShrinkWidthBuffer).Data;
    pIVar9[iVar36].Index = (int)lVar26;
    fVar39 = *(float *)((long)&pIVar27->ContentWidth + lVar37);
    pIVar9[iVar36].InitialWidth = fVar39;
    pIVar9[iVar36].Width = fVar39;
    fVar39 = *(float *)((long)&pIVar27->ContentWidth + lVar37);
    if (fVar39 <= 1.0) {
      fVar39 = 1.0;
    }
    *(float *)((long)&pIVar27->Width + lVar37) = fVar39;
    lVar26 = lVar26 + 1;
    lVar37 = lVar37 + 0x2c;
  }
  fVar39 = 0.0;
  for (lVar26 = 8; lVar26 != 0x2c; lVar26 = lVar26 + 0xc) {
    fVar39 = fVar39 + *(float *)((long)sections + lVar26 + -4) +
                      *(float *)((long)&sections[0].TabCount + lVar26);
  }
  tab_bar->WidthAllTabsIdeal = fVar39;
  pIVar22 = GImGui;
  fVar41 = (tab_bar->BarRect).Max.x;
  if (((1 < iVar36) && (fVar41 - (tab_bar->BarRect).Min.x < fVar39)) &&
     ((tab_bar->Flags & 0x90U) == 0x80)) {
    pIVar7 = GImGui->CurrentWindow;
    local_88.x = GImGui->FontSize + -2.0;
    fVar39 = (GImGui->Style).FramePadding.y;
    local_88.y = fVar39 + fVar39 + GImGui->FontSize;
    IVar8 = (pIVar7->DC).CursorPos;
    arrow_col.x = (GImGui->Style).Colors[0].x;
    arrow_col.y = (GImGui->Style).Colors[0].y;
    uVar18 = (GImGui->Style).Colors[0].z;
    uVar19 = (GImGui->Style).Colors[0].w;
    arrow_col.w = (float)uVar19 * 0.5;
    arrow_col.z = (float)uVar18;
    uStack_110 = 0x1fa8d3;
    PushStyleColor(0,&arrow_col);
    local_78.x = 0.0;
    local_78.y = 0.0;
    local_78.z = 0.0;
    local_78.w = 0.0;
    uStack_110 = 0x1fa8e9;
    PushStyleColor(0x15,&local_78);
    local_68._0_4_ = (pIVar22->IO).KeyRepeatDelay;
    local_68._4_4_ = (pIVar22->IO).KeyRepeatRate;
    (pIVar22->IO).KeyRepeatDelay = 0.25;
    (pIVar22->IO).KeyRepeatRate = 0.2;
    fVar39 = (tab_bar->BarRect).Min.x;
    fVar41 = (tab_bar->BarRect).Max.x - (local_88.x + local_88.x);
    uVar32 = -(uint)(fVar41 <= fVar39);
    fVar41 = (float)(uVar32 & (uint)fVar39 | ~uVar32 & (uint)fVar41);
    fVar39 = (tab_bar->BarRect).Min.y;
    (pIVar7->DC).CursorPos.x = fVar41;
    (pIVar7->DC).CursorPos.y = fVar39;
    uStack_110 = 0x1fa96b;
    size.y = local_88.y;
    size.x = local_88.x;
    bVar24 = ArrowButtonEx("##<",0,size,0x410);
    fVar39 = (tab_bar->BarRect).Min.y;
    (pIVar7->DC).CursorPos.x = fVar41 + local_88.x;
    (pIVar7->DC).CursorPos.y = fVar39;
    uStack_110 = 0x1fa9b4;
    bVar25 = ArrowButtonEx("##>",1,local_88,0x410);
    iVar36 = -(uint)bVar24;
    if (bVar25) {
      iVar36 = 1;
    }
    uStack_110 = 0x1fa9c2;
    PopStyleColor(2);
    (pIVar22->IO).KeyRepeatDelay = (float)(undefined4)local_68;
    (pIVar22->IO).KeyRepeatRate = (float)local_68._4_4_;
    if (iVar36 == 0) {
LAB_001faa50:
      pIVar27 = (ImGuiTabItem *)0x0;
    }
    else {
      uStack_110 = 0x1fa9e1;
      pIVar27 = TabBarFindTabByID(tab_bar,tab_bar->SelectedTabId);
      if (pIVar27 == (ImGuiTabItem *)0x0) goto LAB_001faa50;
      pIVar10 = (tab_bar->Tabs).Data;
      uVar33 = ((long)pIVar27 - (long)pIVar10) / 0x2c;
      iVar28 = iVar36 + (int)uVar33;
      pIVar27 = (ImGuiTabItem *)0x0;
      while (pIVar27 == (ImGuiTabItem *)0x0) {
        if ((iVar28 < 0) || (iVar29 = iVar28, (tab_bar->Tabs).Size <= iVar28)) {
          iVar29 = (int)uVar33;
        }
        pIVar2 = pIVar10 + iVar29;
        pIVar27 = pIVar2;
        if ((pIVar10[iVar29].Flags & 0x200000) != 0) {
          uVar33 = (ulong)(uint)((int)uVar33 + iVar36);
          iVar28 = iVar28 + iVar36;
          if ((-1 < iVar28) && (pIVar27 = (ImGuiTabItem *)0x0, (tab_bar->Tabs).Size <= iVar28)) {
            pIVar27 = pIVar2;
          }
        }
      }
    }
    (pIVar7->DC).CursorPos = IVar8;
    fVar41 = (tab_bar->BarRect).Max.x - (local_88.x + local_88.x + 1.0);
    (tab_bar->BarRect).Max.x = fVar41;
    if ((pIVar27 != (ImGuiTabItem *)0x0) &&
       (local_d8 = pIVar27->ID, (pIVar27->Flags & 0x200000) == 0)) {
      tab_bar->SelectedTabId = local_d8;
    }
  }
  fVar39 = sections[0].Width + sections[0].Spacing + sections[2].Width + sections[2].Spacing;
  fVar41 = fVar41 - (tab_bar->BarRect).Min.x;
  if (fVar39 < fVar41) {
    fVar40 = (sections[1].Spacing + sections[1].Width) -
             ((fVar41 - (sections[0].Width + sections[0].Spacing)) -
             (sections[2].Width + sections[2].Spacing));
    if (0.0 <= fVar40) goto LAB_001faaf7;
  }
  else {
    fVar40 = fVar39 - fVar41;
LAB_001faaf7:
    if ((1.0 <= fVar40) && ((fVar41 <= fVar39 || ((tab_bar->Flags & 0x40U) != 0)))) {
      iVar36 = sections[2].TabCount + sections[0].TabCount;
      if (fVar41 <= fVar39) {
        iVar28 = 0;
      }
      else {
        iVar28 = iVar36;
        iVar36 = sections[1].TabCount;
      }
      lVar26 = (long)iVar28;
      uStack_110 = 0x1facb9;
      ShrinkWidths((pIVar38->ShrinkWidthBuffer).Data + lVar26,iVar36,fVar40);
      lVar37 = lVar26 * 0xc + 4;
      for (; lVar26 < iVar36 + iVar28; lVar26 = lVar26 + 1) {
        pIVar9 = (pIVar38->ShrinkWidthBuffer).Data;
        iVar29 = (int)*(float *)((long)&pIVar9->Index + lVar37);
        if (-1 < iVar29) {
          pIVar27 = (tab_bar->Tabs).Data;
          iVar6 = *(int *)((long)pIVar9 + lVar37 + -4);
          fVar39 = (float)iVar29;
          lVar35 = (ulong)((char)pIVar27[iVar6].Flags < '\0') + 1;
          if ((pIVar27[iVar6].Flags & 0x40U) != 0) {
            lVar35 = 0;
          }
          fVar41 = 1.0;
          if (1.0 <= fVar39) {
            fVar41 = fVar39;
          }
          sections[lVar35].Width = sections[lVar35].Width - (pIVar27[iVar6].Width - fVar41);
          pIVar27[iVar6].Width = fVar41;
        }
        lVar37 = lVar37 + 0xc;
      }
    }
  }
  tab_bar->WidthAllTabs = 0.0;
  iVar36 = 0;
  fVar39 = 0.0;
  for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
    fVar41 = fVar39;
    if ((lVar26 == 2) &&
       (fVar41 = ((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x) - sections[2].Width,
       fVar41 = (float)(~-(uint)(fVar41 <= 0.0) & (uint)fVar41), fVar39 <= fVar41)) {
      fVar41 = fVar39;
    }
    uVar33 = (ulong)(uint)sections[lVar26].TabCount;
    lVar37 = (long)iVar36 * 0x2c + 0x14;
    for (lVar35 = 0; lVar35 < (int)uVar33; lVar35 = lVar35 + 1) {
      pIVar27 = (tab_bar->Tabs).Data;
      *(float *)((long)pIVar27 + lVar37 + -4) = fVar41;
      uVar33 = (ulong)sections[lVar26].TabCount;
      fVar39 = 0.0;
      if (lVar35 < (long)(uVar33 - 1)) {
        fVar39 = (pIVar38->Style).ItemInnerSpacing.x;
      }
      fVar41 = fVar41 + fVar39 + *(float *)((long)&pIVar27->ID + lVar37);
      lVar37 = lVar37 + 0x2c;
    }
    fVar39 = sections[lVar26].Spacing;
    fVar40 = sections[lVar26].Width + fVar39;
    tab_bar->WidthAllTabs = (float)(-(uint)(0.0 <= fVar40) & (uint)fVar40) + tab_bar->WidthAllTabs;
    fVar39 = fVar41 + fVar39;
    iVar36 = (int)uVar33 + iVar36;
  }
  if (bVar23) {
    IVar34 = tab_bar->SelectedTabId;
    if (IVar34 == 0) goto LAB_001fabf2;
  }
  else {
    tab_bar->SelectedTabId = 0;
LAB_001fabf2:
    IVar34 = 0;
    if ((tab_bar->NextSelectedTabId == 0) && (IVar34 = 0, pIVar31 != (ImGuiID *)0x0)) {
      IVar34 = *pIVar31;
      tab_bar->SelectedTabId = IVar34;
      local_d8 = IVar34;
    }
  }
  tab_bar->VisibleTabId = IVar34;
  tab_bar->VisibleTabWasSubmitted = false;
  if (local_d8 != 0) {
    uStack_110 = 0x1fac22;
    pIVar27 = TabBarFindTabByID(tab_bar,local_d8);
    if ((pIVar27 != (ImGuiTabItem *)0x0) && ((pIVar27->Flags & 0xc0) == 0)) {
      fVar39 = GImGui->FontSize;
      fVar40 = pIVar27->Offset - sections[0].Width;
      iVar36 = (int)(((long)pIVar27 - (long)(tab_bar->Tabs).Data) / 0x2c);
      fVar41 = fVar39;
      if (iVar36 < sections[0].TabCount) {
        fVar41 = -0.0;
      }
      fVar41 = fVar40 - fVar41;
      fVar43 = pIVar27->Width;
      if ((tab_bar->Tabs).Size - sections[2].TabCount <= iVar36 + 1) {
        fVar39 = 1.0;
      }
      fVar42 = ((((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x) - sections[0].Width) -
               sections[2].Width) - sections[1].Spacing;
      tab_bar->ScrollingTargetDistToVisibility = 0.0;
      fVar39 = fVar40 + fVar43 + fVar39;
      if ((fVar41 < tab_bar->ScrollingTarget) || (fVar42 <= fVar39 - fVar41)) {
        fVar40 = tab_bar->ScrollingAnim - fVar39;
      }
      else {
        if (fVar39 - fVar42 <= tab_bar->ScrollingTarget) goto LAB_001fadd8;
        fVar40 = (fVar41 - fVar42) - tab_bar->ScrollingAnim;
        fVar41 = fVar39 - fVar42;
      }
      tab_bar->ScrollingTargetDistToVisibility = (float)(-(uint)(0.0 <= fVar40) & (uint)fVar40);
      tab_bar->ScrollingTarget = fVar41;
    }
  }
LAB_001fadd8:
  uStack_110 = 0x1fade5;
  fVar39 = TabBarScrollClamp(tab_bar,tab_bar->ScrollingAnim);
  tab_bar->ScrollingAnim = fVar39;
  uStack_110 = 0x1fadfc;
  fVar41 = TabBarScrollClamp(tab_bar,tab_bar->ScrollingTarget);
  tab_bar->ScrollingTarget = fVar41;
  if ((fVar39 != fVar41) || (NAN(fVar39) || NAN(fVar41))) {
    fVar40 = pIVar38->FontSize * 70.0;
    uVar32 = -(uint)(fVar40 <= tab_bar->ScrollingSpeed);
    fVar43 = ABS(fVar41 - fVar39) / 0.3;
    fVar40 = (float)(~uVar32 & (uint)fVar40 | (uint)tab_bar->ScrollingSpeed & uVar32);
    uVar32 = -(uint)(fVar43 <= fVar40);
    fVar43 = (float)(~uVar32 & (uint)fVar43 | uVar32 & (uint)fVar40);
    tab_bar->ScrollingSpeed = fVar43;
    fVar40 = fVar41;
    if ((pIVar38->FrameCount <= tab_bar->PrevFrameVisible + 1) &&
       (tab_bar->ScrollingTargetDistToVisibility <= pIVar38->FontSize * 10.0)) {
      fVar43 = fVar43 * (pIVar38->IO).DeltaTime;
      if (fVar41 <= fVar39) {
        fVar40 = fVar39;
        if (fVar41 < fVar39) {
          fVar39 = fVar39 - fVar43;
          uVar32 = -(uint)(fVar41 <= fVar39);
          fVar40 = (float)((uint)fVar39 & uVar32 | ~uVar32 & (uint)fVar41);
        }
      }
      else {
        fVar40 = fVar39 + fVar43;
        if (fVar41 <= fVar40) {
          fVar40 = fVar41;
        }
      }
    }
    tab_bar->ScrollingAnim = fVar40;
  }
  else {
    tab_bar->ScrollingSpeed = 0.0;
  }
  fVar39 = (tab_bar->BarRect).Max.x;
  tab_bar->ScrollingRectMinX = (tab_bar->BarRect).Min.x + sections[0].Width + sections[0].Spacing;
  tab_bar->ScrollingRectMaxX = (fVar39 - sections[2].Width) - sections[1].Spacing;
  if ((tab_bar->Flags & 0x100000) == 0) {
    uStack_110 = 0x1faee2;
    ImVector<char>::resize(&(tab_bar->TabsNames).Buf,0);
  }
  pIVar7 = pIVar38->CurrentWindow;
  (pIVar7->DC).CursorPos = (tab_bar->BarRect).Min;
  arrow_col.y = (tab_bar->BarRect).Max.y - (tab_bar->BarRect).Min.y;
  arrow_col.x = tab_bar->WidthAllTabs;
  uStack_110 = 0x1faf1e;
  ItemSize((ImVec2 *)&arrow_col,(tab_bar->FramePadding).y);
  fVar41 = (tab_bar->BarRect).Min.x + tab_bar->WidthAllTabsIdeal;
  fVar39 = (pIVar7->DC).IdealMaxPos.x;
  uVar32 = -(uint)(fVar41 <= fVar39);
  (pIVar7->DC).IdealMaxPos.x = (float)(uVar32 & (uint)fVar39 | ~uVar32 & (uint)fVar41);
  return;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect by compacting list
    // Detect if we need to sort out tab list (e.g. in rare case where a tab changed section)
    int tab_dst_n = 0;
    bool need_sort_by_section = false;
    ImGuiTabBarSection sections[3]; // Layout sections: Leading, Central, Trailing
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible || tab->WantClose)
        {
            // Remove tab
            if (tab_bar->VisibleTabId == tab->ID) { tab_bar->VisibleTabId = 0; }
            if (tab_bar->SelectedTabId == tab->ID) { tab_bar->SelectedTabId = 0; }
            if (tab_bar->NextSelectedTabId == tab->ID) { tab_bar->NextSelectedTabId = 0; }
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];

        tab = &tab_bar->Tabs[tab_dst_n];
        tab->IndexDuringLayout = (ImS16)tab_dst_n;

        // We will need sorting if tabs have changed section (e.g. moved from one of Leading/Central/Trailing to another)
        int curr_tab_section_n = TabItemGetSectionIdx(tab);
        if (tab_dst_n > 0)
        {
            ImGuiTabItem* prev_tab = &tab_bar->Tabs[tab_dst_n - 1];
            int prev_tab_section_n = TabItemGetSectionIdx(prev_tab);
            if (curr_tab_section_n == 0 && prev_tab_section_n != 0)
                need_sort_by_section = true;
            if (prev_tab_section_n == 2 && curr_tab_section_n != 2)
                need_sort_by_section = true;
        }

        sections[curr_tab_section_n].TabCount++;
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    if (need_sort_by_section)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerBySection);

    // Calculate spacing between sections
    sections[0].Spacing = sections[0].TabCount > 0 && (sections[1].TabCount + sections[2].TabCount) > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;
    sections[1].Spacing = sections[1].TabCount > 0 && sections[2].TabCount > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;

    // Setup next selected tab
    ImGuiID scroll_to_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_to_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (TabBarProcessReorder(tab_bar))
            if (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)
                scroll_to_tab_id = tab_bar->ReorderRequestTabId;
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Min.x!
            scroll_to_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // Leading/Trailing tabs will be shrink only if central one aren't visible anymore, so layout the shrink data as: leading, trailing, central
    // (whereas our tabs are stored as: leading, central, trailing)
    int shrink_buffer_indexes[3] = { 0, sections[0].TabCount + sections[2].TabCount, sections[0].TabCount };
    g.ShrinkWidthBuffer.resize(tab_bar->Tabs.Size);

    // Compute ideal tabs widths + store them into shrink buffer
    ImGuiTabItem* most_recently_selected_tab = NULL;
    int curr_section_n = -1;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if ((most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected) && !(tab->Flags & ImGuiTabItemFlags_Button))
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;
        if (scroll_to_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_to_tab_id = tab->ID;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        const bool has_close_button_or_unsaved_marker = (tab->Flags & ImGuiTabItemFlags_NoCloseButton) == 0 || (tab->Flags & ImGuiTabItemFlags_UnsavedDocument);
        tab->ContentWidth = (tab->RequestedWidth >= 0.0f) ? tab->RequestedWidth : TabItemCalcSize(tab_name, has_close_button_or_unsaved_marker).x;

        int section_n = TabItemGetSectionIdx(tab);
        ImGuiTabBarSection* section = &sections[section_n];
        section->Width += tab->ContentWidth + (section_n == curr_section_n ? g.Style.ItemInnerSpacing.x : 0.0f);
        curr_section_n = section_n;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        IM_MSVC_WARNING_SUPPRESS(6385);
        ImGuiShrinkWidthItem* shrink_width_item = &g.ShrinkWidthBuffer[shrink_buffer_indexes[section_n]++];
        shrink_width_item->Index = tab_n;
        shrink_width_item->Width = shrink_width_item->InitialWidth = tab->ContentWidth;
        tab->Width = ImMax(tab->ContentWidth, 1.0f);
    }

    // Compute total ideal width (used for e.g. auto-resizing a window)
    tab_bar->WidthAllTabsIdeal = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
        tab_bar->WidthAllTabsIdeal += sections[section_n].Width + sections[section_n].Spacing;

    // Horizontal scrolling buttons
    // (note that TabBarScrollButtons() will alter BarRect.Max.x)
    if ((tab_bar->WidthAllTabsIdeal > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll))
        if (ImGuiTabItem* scroll_and_select_tab = TabBarScrollingButtons(tab_bar))
        {
            scroll_to_tab_id = scroll_and_select_tab->ID;
            if ((scroll_and_select_tab->Flags & ImGuiTabItemFlags_Button) == 0)
                tab_bar->SelectedTabId = scroll_to_tab_id;
        }

    // Shrink widths if full tabs don't fit in their allocated space
    float section_0_w = sections[0].Width + sections[0].Spacing;
    float section_1_w = sections[1].Width + sections[1].Spacing;
    float section_2_w = sections[2].Width + sections[2].Spacing;
    bool central_section_is_visible = (section_0_w + section_2_w) < tab_bar->BarRect.GetWidth();
    float width_excess;
    if (central_section_is_visible)
        width_excess = ImMax(section_1_w - (tab_bar->BarRect.GetWidth() - section_0_w - section_2_w), 0.0f); // Excess used to shrink central section
    else
        width_excess = (section_0_w + section_2_w) - tab_bar->BarRect.GetWidth(); // Excess used to shrink leading/trailing section

    // With ImGuiTabBarFlags_FittingPolicyScroll policy, we will only shrink leading/trailing if the central section is not visible anymore
    if (width_excess >= 1.0f && ((tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown) || !central_section_is_visible))
    {
        int shrink_data_count = (central_section_is_visible ? sections[1].TabCount : sections[0].TabCount + sections[2].TabCount);
        int shrink_data_offset = (central_section_is_visible ? sections[0].TabCount + sections[2].TabCount : 0);
        ShrinkWidths(g.ShrinkWidthBuffer.Data + shrink_data_offset, shrink_data_count, width_excess);

        // Apply shrunk values into tabs and sections
        for (int tab_n = shrink_data_offset; tab_n < shrink_data_offset + shrink_data_count; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[g.ShrinkWidthBuffer[tab_n].Index];
            float shrinked_width = IM_FLOOR(g.ShrinkWidthBuffer[tab_n].Width);
            if (shrinked_width < 0.0f)
                continue;

            shrinked_width = ImMax(1.0f, shrinked_width);
            int section_n = TabItemGetSectionIdx(tab);
            sections[section_n].Width -= (tab->Width - shrinked_width);
            tab->Width = shrinked_width;
        }
    }

    // Layout all active tabs
    int section_tab_index = 0;
    float tab_offset = 0.0f;
    tab_bar->WidthAllTabs = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
    {
        ImGuiTabBarSection* section = &sections[section_n];
        if (section_n == 2)
            tab_offset = ImMin(ImMax(0.0f, tab_bar->BarRect.GetWidth() - section->Width), tab_offset);

        for (int tab_n = 0; tab_n < section->TabCount; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[section_tab_index + tab_n];
            tab->Offset = tab_offset;
            tab_offset += tab->Width + (tab_n < section->TabCount - 1 ? g.Style.ItemInnerSpacing.x : 0.0f);
        }
        tab_bar->WidthAllTabs += ImMax(section->Width + section->Spacing, 0.0f);
        tab_offset += section->Spacing;
        section_tab_index += section->TabCount;
    }

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_to_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_to_tab_id != 0)
        TabBarScrollToTab(tab_bar, scroll_to_tab_id, sections);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }
    tab_bar->ScrollingRectMinX = tab_bar->BarRect.Min.x + sections[0].Width + sections[0].Spacing;
    tab_bar->ScrollingRectMaxX = tab_bar->BarRect.Max.x - sections[2].Width - sections[1].Spacing;

    // Clear name buffers
    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        tab_bar->TabsNames.Buf.resize(0);

    // Actual layout in host window (we don't do it in BeginTabBar() so as not to waste an extra frame)
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.CursorPos = tab_bar->BarRect.Min;
    ItemSize(ImVec2(tab_bar->WidthAllTabs, tab_bar->BarRect.GetHeight()), tab_bar->FramePadding.y);
    window->DC.IdealMaxPos.x = ImMax(window->DC.IdealMaxPos.x, tab_bar->BarRect.Min.x + tab_bar->WidthAllTabsIdeal);
}